

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *vec;
  int *piVar6;
  double *pdVar7;
  int *ridx2;
  double *pdVar8;
  long lVar9;
  Real RVar10;
  double dVar11;
  int n1;
  int n2;
  Real local_70;
  int *local_68;
  pointer local_60;
  SSVectorBase<double> *local_58;
  SSVectorBase<double> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_50 = rhs2;
  (*this->solveTime->_vptr_Timer[3])();
  local_60 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (this->ssvec).setupStatus = false;
  local_68 = (this->ssvec).super_IdxSet.idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_70 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  SSVectorBase<double>::clear(y);
  iVar1 = rhs1->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if ((long)iVar1 < 1) {
    n1 = 0;
  }
  else {
    lVar9 = 0;
    local_58 = y;
    do {
      iVar2 = *(int *)((long)&rhs1->m_elem->idx + lVar9);
      local_48 = *(double *)((long)&rhs1->m_elem->val + lVar9);
      uStack_40 = 0;
      RVar10 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar11 = 0.0;
      if (RVar10 < ABS(local_48)) {
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
        dVar11 = local_48;
      }
      pdVar4[iVar2] = dVar11;
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar9);
    n1 = (this->ssvec).super_IdxSet.num;
    y = local_58;
  }
  (this->ssvec).setupStatus = true;
  n2 = (local_50->super_IdxSet).num;
  piVar5 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  if (n2 < 10) {
    piVar6 = (y->super_IdxSet).idx;
    pdVar7 = (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    y->setupStatus = false;
    ridx2 = (local_50->super_IdxSet).idx;
    pdVar8 = (local_50->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_50->setupStatus = false;
    CLUFactor<double>::vSolveLeft2sparse
              (&this->super_CLUFactor<double>,local_70,vec,piVar5,local_60,local_68,&n1,pdVar7,
               piVar6,pdVar8,ridx2,&n2);
    y->setupStatus = false;
    (y->super_IdxSet).num = n2;
    if (0 < n2) {
      y->setupStatus = true;
    }
  }
  else {
    y->setupStatus = false;
    pdVar7 = (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = (local_50->super_IdxSet).idx;
    pdVar8 = (local_50->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_50->setupStatus = false;
    n1 = CLUFactor<double>::vSolveLeft2
                   (&this->super_CLUFactor<double>,local_70,vec,piVar5,local_60,local_68,n1,pdVar7,
                    pdVar8,piVar6,n2);
  }
  x->setupStatus = false;
  (x->super_IdxSet).num = n1;
  if (0 < n1) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n1, n2;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();

   if(n2 < 10)
   {
      this->vSolveLeft2sparse(epsilon,
                              x.altValues(), x.altIndexMem(),
                              svec, sidx, n1,
                              y.altValues(), y.altIndexMem(),
                              rhs2.altValues(), rhs2.altIndexMem(), n2);
      y.setSize(n2);

      if(n2 > 0)
         y.forceSetup();
   }
   else
   {
      n1 = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n1,
                             y.altValues(), rhs2.altValues(), rhs2.altIndexMem(), n2);
      //      y.setup();
   }

   x.setSize(n1);

   if(n1 > 0)
      x.forceSetup();

   //   if (n2 > 0)
   //      y.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}